

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_reset_subblock_info(btreeblk_handle *handle)

{
  long in_RDI;
  uint32_t idx;
  uint32_t sb_no;
  uint64_t in_stack_ffffffffffffffe8;
  uint uVar1;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 0x58); uVar2 = uVar2 + 1) {
    if (*(long *)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18) != -1) {
      for (uVar1 = 0; uVar1 < *(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18 + 0xc);
          uVar1 = uVar1 + 1) {
        if (*(char *)(*(long *)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18 + 0x10) +
                     (ulong)uVar1) == '\0') {
          _btreeblk_add_stale_block
                    ((btreeblk_handle *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffe8,0);
        }
      }
      *(undefined8 *)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18) = 0xffffffffffffffff;
    }
    memset(*(void **)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18 + 0x10),0,
           (ulong)*(ushort *)(*(long *)(in_RDI + 0x60) + (ulong)uVar2 * 0x18 + 0xc));
  }
  return;
}

Assistant:

void btreeblk_reset_subblock_info(struct btreeblk_handle *handle)
{
#ifdef __BTREEBLK_SUBBLOCK
    uint32_t sb_no, idx;

    for (sb_no=0;sb_no<handle->nsb;++sb_no){
        if (handle->sb[sb_no].bid != BLK_NOT_FOUND) {
            // first of all, make all unused subblocks as stale
            for (idx=0; idx<handle->sb[sb_no].nblocks; ++idx) {
                if (handle->sb[sb_no].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[sb_no].bid * handle->nodesize)
                            + (idx * handle->sb[sb_no].sb_size),
                        handle->sb[sb_no].sb_size);
                }
            }
            handle->sb[sb_no].bid = BLK_NOT_FOUND;
        }
        // clear all info in each subblock set
        memset(handle->sb[sb_no].bitmap, 0, handle->sb[sb_no].nblocks);
    }
#endif
}